

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger string_slice(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  SQRESULT SVar3;
  char *err;
  SQObjectPtr o;
  SQInteger eidx;
  SQObjectPtr local_38;
  long local_28;
  long local_20;
  SQObjectPtr local_18;
  
  local_38.super_SQObject._type = OT_NULL;
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  get_slice_params(v,&local_20,&local_28,&local_38);
  uVar2 = (local_38.super_SQObject._unVal.pString)->_len;
  local_20 = (local_20 >> 0x3f & uVar2) + local_20;
  local_28 = (local_28 >> 0x3f & uVar2) + local_28;
  if (local_28 < local_20) {
    err = "wrong indexes";
  }
  else {
    if (local_28 <= (long)uVar2 && -1 < local_20) {
      local_18.super_SQObject._unVal.pString =
           SQString::Create(v->_sharedstate,
                            (SQChar *)
                            ((long)&(local_38.super_SQObject._unVal.pTable)->_firstfree + local_20),
                            local_28 - local_20);
      local_18.super_SQObject._type = OT_STRING;
      pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQVM::Push(v,&local_18);
      SQObjectPtr::~SQObjectPtr(&local_18);
      SVar3 = 1;
      goto LAB_001311f6;
    }
    err = "slice out of range";
  }
  SVar3 = sq_throwerror(v,err);
LAB_001311f6:
  SQObjectPtr::~SQObjectPtr(&local_38);
  return SVar3;
}

Assistant:

static SQInteger string_slice(HSQUIRRELVM v)
{
    SQInteger sidx,eidx;
    SQObjectPtr o;
    if(SQ_FAILED(get_slice_params(v,sidx,eidx,o)))return -1;
    SQInteger slen = _string(o)->_len;
    if(sidx < 0)sidx = slen + sidx;
    if(eidx < 0)eidx = slen + eidx;
    if(eidx < sidx) return sq_throwerror(v,_SC("wrong indexes"));
    if(eidx > slen || sidx < 0) return sq_throwerror(v, _SC("slice out of range"));
    v->Push(SQString::Create(_ss(v),&_stringval(o)[sidx],eidx-sidx));
    return 1;
}